

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

ssize_t write_data_block(archive_write_disk *a,char *buff,size_t size)

{
  wchar_t wVar1;
  long lVar2;
  __off_t _Var3;
  uint *puVar4;
  ssize_t sVar5;
  size_t in_RDX;
  char *in_RSI;
  archive *in_RDI;
  int64_t block_end;
  char *end;
  char *p;
  wchar_t r;
  ssize_t bytes_to_write;
  ssize_t block_size;
  ssize_t bytes_written;
  uint64_t start_size;
  archive_write_disk *in_stack_ffffffffffffff88;
  char *local_50;
  size_t local_40;
  long local_38;
  size_t local_20;
  char *local_18;
  long local_8;
  
  local_38 = 0;
  if (in_RDX == 0) {
    local_8 = 0;
  }
  else if ((*(long *)&in_RDI[4].compression_code == 0) || ((int)in_RDI[4].state < 0)) {
    archive_set_error(in_RDI,0,"Attempt to write to an empty file");
    local_8 = -0x14;
  }
  else {
    if ((in_RDI[4].magic & 0x1000) != 0) {
      wVar1 = lazy_stat(in_stack_ffffffffffffff88);
      if (wVar1 != L'\0') {
        return (long)wVar1;
      }
      local_38 = *(long *)(in_RDI[3].error + 0x38);
    }
    local_20 = in_RDX;
    local_18 = in_RSI;
    if ((-1 < *(long *)&in_RDI[4].compression_code) &&
       (*(long *)&in_RDI[4].compression_code <
        (long)((long)&(in_RDI[4].vtable)->archive_close + in_RDX))) {
      local_20 = *(long *)&in_RDI[4].compression_code - (long)in_RDI[4].vtable;
      in_RDX = local_20;
    }
    while (local_20 != 0) {
      if (local_38 == 0) {
        local_40 = local_20;
      }
      else {
        for (local_50 = local_18; (local_50 < local_18 + local_20 && (*local_50 == '\0'));
            local_50 = local_50 + 1) {
        }
        in_RDI[4].vtable =
             (archive_vtable_conflict *)(((long)local_50 - (long)local_18) + (long)in_RDI[4].vtable)
        ;
        local_20 = local_20 - ((long)local_50 - (long)local_18);
        local_18 = local_50;
        if (local_20 == 0) {
          local_20 = 0;
          break;
        }
        lVar2 = ((long)in_RDI[4].vtable / local_38 + 1) * local_38;
        local_40 = local_20;
        if (lVar2 < (long)((long)in_RDI[4].vtable + local_20)) {
          local_40 = lVar2 - (long)in_RDI[4].vtable;
        }
      }
      if (in_RDI[4].vtable != *(archive_vtable_conflict **)&in_RDI[4].archive_format) {
        _Var3 = lseek(in_RDI[4].state,(__off_t)in_RDI[4].vtable,0);
        if (_Var3 < 0) {
          puVar4 = (uint *)__errno_location();
          archive_set_error(in_RDI,(int)(ulong)*puVar4,"Seek failed");
          return -0x1e;
        }
        *(archive_vtable_conflict **)&in_RDI[4].archive_format = in_RDI[4].vtable;
      }
      sVar5 = write(in_RDI[4].state,local_18,local_40);
      if (sVar5 < 0) {
        puVar4 = (uint *)__errno_location();
        archive_set_error(in_RDI,(int)(ulong)*puVar4,"Write failed");
        return -0x14;
      }
      local_18 = local_18 + sVar5;
      local_20 = local_20 - sVar5;
      in_RDI[4].archive_format_name = in_RDI[4].archive_format_name + sVar5;
      in_RDI[4].vtable =
           (archive_vtable_conflict *)((long)&(in_RDI[4].vtable)->archive_close + sVar5);
      *(archive_vtable_conflict **)&in_RDI[4].archive_format = in_RDI[4].vtable;
    }
    local_8 = in_RDX - local_20;
  }
  return local_8;
}

Assistant:

static ssize_t
write_data_block(struct archive_write_disk *a, const char *buff, size_t size)
{
	uint64_t start_size = size;
	ssize_t bytes_written = 0;
	ssize_t block_size = 0, bytes_to_write;

	if (size == 0)
		return (ARCHIVE_OK);

	if (a->filesize == 0 || a->fd < 0) {
		archive_set_error(&a->archive, 0,
		    "Attempt to write to an empty file");
		return (ARCHIVE_WARN);
	}

	if (a->flags & ARCHIVE_EXTRACT_SPARSE) {
#if HAVE_STRUCT_STAT_ST_BLKSIZE
		int r;
		if ((r = lazy_stat(a)) != ARCHIVE_OK)
			return (r);
		block_size = a->pst->st_blksize;
#else
		/* XXX TODO XXX Is there a more appropriate choice here ? */
		/* This needn't match the filesystem allocation size. */
		block_size = 16*1024;
#endif
	}

	/* If this write would run beyond the file size, truncate it. */
	if (a->filesize >= 0 && (int64_t)(a->offset + size) > a->filesize)
		start_size = size = (size_t)(a->filesize - a->offset);

	/* Write the data. */
	while (size > 0) {
		if (block_size == 0) {
			bytes_to_write = size;
		} else {
			/* We're sparsifying the file. */
			const char *p, *end;
			int64_t block_end;

			/* Skip leading zero bytes. */
			for (p = buff, end = buff + size; p < end; ++p) {
				if (*p != '\0')
					break;
			}
			a->offset += p - buff;
			size -= p - buff;
			buff = p;
			if (size == 0)
				break;

			/* Calculate next block boundary after offset. */
			block_end
			    = (a->offset / block_size + 1) * block_size;

			/* If the adjusted write would cross block boundary,
			 * truncate it to the block boundary. */
			bytes_to_write = size;
			if (a->offset + bytes_to_write > block_end)
				bytes_to_write = block_end - a->offset;
		}
		/* Seek if necessary to the specified offset. */
		if (a->offset != a->fd_offset) {
			if (lseek(a->fd, a->offset, SEEK_SET) < 0) {
				archive_set_error(&a->archive, errno,
				    "Seek failed");
				return (ARCHIVE_FATAL);
			}
			a->fd_offset = a->offset;
		}
		bytes_written = write(a->fd, buff, bytes_to_write);
		if (bytes_written < 0) {
			archive_set_error(&a->archive, errno, "Write failed");
			return (ARCHIVE_WARN);
		}
		buff += bytes_written;
		size -= bytes_written;
		a->total_bytes_written += bytes_written;
		a->offset += bytes_written;
		a->fd_offset = a->offset;
	}
	return (start_size - size);
}